

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O3

bool __thiscall FSerializer::BeginObject(FSerializer *this,char *name)

{
  FWriter *pFVar1;
  FReader *this_00;
  Pointer pGVar2;
  FJSONObject *pFVar3;
  TArray<FJSONObject,_FJSONObject> *pTVar4;
  uint uVar5;
  Value *pVVar6;
  
  if (this->w == (FWriter *)0x0) {
    pVVar6 = FReader::FindKey(this->r,name);
    if (pVVar6 == (Value *)0x0) {
      return false;
    }
    if ((pVVar6->data_).f.flags != 3) {
      __assert_fail("val->IsObject()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                    ,0x249,"bool FSerializer::BeginObject(const char *)");
    }
    this_00 = this->r;
    pGVar2 = (Pointer)(pVVar6->data_).s.str;
    TArray<FJSONObject,_FJSONObject>::Grow(&this_00->mObjects,1);
    pFVar3 = (this_00->mObjects).Array;
    uVar5 = (this_00->mObjects).Count;
    pTVar4 = &this_00->mObjects;
    pFVar3[uVar5].mObject = pVVar6;
    pFVar3[uVar5].mIterator.ptr_ = pGVar2;
    pFVar3[uVar5].mIndex = 0;
  }
  else {
    WriteKey(this,name);
    FWriter::StartObject(this->w);
    pFVar1 = this->w;
    TArray<bool,_bool>::Grow(&pFVar1->mInObject,1);
    uVar5 = (pFVar1->mInObject).Count;
    pTVar4 = (TArray<FJSONObject,_FJSONObject> *)&pFVar1->mInObject;
    (pFVar1->mInObject).Array[uVar5] = true;
  }
  pTVar4->Count = uVar5 + 1;
  return true;
}

Assistant:

bool FSerializer::BeginObject(const char *name)
{
	if (isWriting())
	{
		WriteKey(name);
		w->StartObject();
		w->mInObject.Push(true);
	}
	else
	{
		auto val = r->FindKey(name);
		if (val != nullptr)
		{
			assert(val->IsObject());
			if (val->IsObject())
			{
				r->mObjects.Push(FJSONObject(val));
			}
			else
			{
				Printf(TEXTCOLOR_RED "Object expected for '%s'", name);
				mErrors++;
				return false;
			}
		}
		else
		{
			return false;
		}
	}
	return true;
}